

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quarticSolver.cpp
# Opt level: O0

void testEigen(void)

{
  initializer_list<double> __l;
  allocator<double> local_69;
  double local_68 [4];
  iterator local_48;
  size_type local_40;
  vector<double,_std::allocator<double>_> local_38;
  vector<double,_std::allocator<double>_> local_20;
  
  local_68[2] = -1.87832;
  local_68[3] = -0.882024;
  local_68[0] = 1.87832;
  local_68[1] = -0.0950376;
  local_48 = local_68;
  local_40 = 4;
  std::allocator<double>::allocator(&local_69);
  __l._M_len = local_40;
  __l._M_array = local_48;
  std::vector<double,_std::allocator<double>_>::vector(&local_38,__l,&local_69);
  eigenSolverMonic(&local_20,&local_38);
  std::vector<double,_std::allocator<double>_>::~vector(&local_20);
  std::vector<double,_std::allocator<double>_>::~vector(&local_38);
  std::allocator<double>::~allocator(&local_69);
  return;
}

Assistant:

void testEigen()
{
    eigenSolverMonic({{1.87832,-0.0950376,-1.87832,-0.882024}});
}